

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle.cpp
# Opt level: O3

int __thiscall
QCommonStyle::pixelMetric(QCommonStyle *this,PixelMetric m,QStyleOption *opt,QWidget *widget)

{
  int iVar1;
  int iVar2;
  QStyle *pQVar3;
  long lVar4;
  int iVar5;
  undefined8 uVar6;
  code *UNRECOVERED_JUMPTABLE;
  int iVar7;
  long in_FS_OFFSET;
  bool bVar8;
  qreal qVar9;
  QVariant local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (PM_LineEditIconMargin < m) {
switchD_003376e9_caseD_1:
    iVar5 = 0;
    goto switchD_003376e9_caseD_3;
  }
  pQVar3 = (QStyle *)
           ((long)&switchD_003376e9::switchdataD_00666fe4 +
           (long)(int)(&switchD_003376e9::switchdataD_00666fe4)[m]);
  iVar5 = 2;
  switch(m) {
  case PM_ButtonMargin:
  case PM_DockWidgetSeparatorExtent:
  case PM_ToolBarSeparatorExtent:
  case PM_CheckBoxLabelSpacing:
  case PM_RadioButtonLabelSpacing:
  case PM_LayoutHorizontalSpacing:
  case PM_LayoutVerticalSpacing:
    qVar9 = 6.0;
    break;
  default:
    goto switchD_003376e9_caseD_1;
  case PM_MenuButtonIndicator:
  case PM_ExclusiveIndicatorWidth:
  case PM_ExclusiveIndicatorHeight:
  case PM_ToolBarExtensionExtent:
    qVar9 = 12.0;
    break;
  case PM_ButtonShiftHorizontal:
  case PM_ButtonShiftVertical:
  case PM_DefaultFrameWidth:
  case PM_MenuBarPanelWidth:
  case PM_TabBarTabShiftVertical:
  case PM_SpinBoxSliderHeight:
  case PM_FocusFrameVMargin:
  case PM_FocusFrameHMargin:
    goto switchD_003376e9_caseD_3;
  case PM_SpinBoxFrameWidth:
  case PM_ComboBoxFrameWidth:
  case PM_TabBarBaseHeight:
  case PM_TabBarBaseOverlap:
  case PM_MenuPanelWidth:
    pQVar3 = QStyle::proxy(pQVar3);
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)pQVar3 + 0xe0);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_00337ca5;
    uVar6 = 5;
    goto LAB_003379d3;
  case PM_MaximumDragDistance:
    lVar4 = *QGuiApplicationPrivate::platform_theme;
    uVar6 = 10;
    goto LAB_00337a6e;
  case PM_ScrollBarExtent:
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (iVar5 = 0x10, opt->type != 0xf0001)
       ) goto switchD_003376e9_caseD_b;
    goto switchD_003376e9_caseD_3;
  case PM_ScrollBarSliderMin:
switchD_003376e9_caseD_a:
    qVar9 = 9.0;
    break;
  case PM_SliderThickness:
  case PM_HeaderMarkSize:
  case PM_TabBarScrollButtonWidth:
  case PM_SmallIconSize:
  case PM_ButtonIconSize:
  case PM_TabCloseIndicatorWidth:
  case PM_TabCloseIndicatorHeight:
  case PM_TitleBarButtonIconSize:
  case PM_TitleBarButtonSize:
switchD_003376e9_caseD_b:
    qVar9 = 16.0;
    break;
  case PM_SliderTickmarkOffset:
    iVar5 = 0;
    if (((opt != (QStyleOption *)0x0) && (0 < opt->version)) && (opt->type == 0xf0001)) {
      pQVar3 = (QStyle *)
               (ulong)(opt[1].state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                       super_QFlagsStorage<QStyle::StateFlag>.i == 1);
      iVar7 = ((&(opt->rect).x2)[(long)pQVar3].m_i - (&(opt->rect).x1)[(long)pQVar3].m_i) + 1;
      pQVar3 = QStyle::proxy(pQVar3);
      iVar2 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0xc,opt,widget);
      iVar1 = opt[1].rect.y1.m_i;
      if (iVar1 == 1) {
        iVar5 = iVar7 - iVar2;
      }
      else if (iVar1 == 3) {
        iVar5 = (iVar7 - iVar2) / 2;
      }
    }
    goto switchD_003376e9_caseD_3;
  case PM_SliderSpaceAvailable:
    iVar5 = 0;
    if (((opt != (QStyleOption *)0x0) && (0 < opt->version)) && (opt->type == 0xf0001)) {
      if (opt[1].state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
          super_QFlagsStorage<QStyle::StateFlag>.i == 1) {
        iVar5 = (opt->rect).x1.m_i;
        iVar1 = (opt->rect).x2.m_i;
      }
      else {
        iVar5 = (opt->rect).y1.m_i;
        iVar1 = (opt->rect).y2.m_i;
      }
      pQVar3 = QStyle::proxy(pQVar3);
      iVar2 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0xd,opt,widget);
      iVar5 = (iVar1 - (iVar2 + iVar5)) + 1;
    }
    goto switchD_003376e9_caseD_3;
  case PM_DockWidgetHandleExtent:
  case PM_ToolBarHandleExtent:
    qVar9 = 8.0;
    break;
  case PM_DockWidgetFrameWidth:
    qVar9 = 1.0;
    break;
  case PM_TabBarTabOverlap:
    iVar5 = 3;
    goto switchD_003376e9_caseD_3;
  case PM_TabBarTabHSpace:
    goto switchD_003376e9_caseD_14;
  case PM_TabBarTabVSpace:
    if (((opt != (QStyleOption *)0x0) && (0 < opt->version)) && (opt->type == 3)) {
      iVar5 = 8;
      if (((uint)opt[1].version < 4) || (iVar5 = 3, (opt[1].version & 0xfffffffeU) == 6))
      goto switchD_003376e9_caseD_3;
    }
    iVar5 = 2;
    goto switchD_003376e9_caseD_3;
  case PM_ProgressBarChunkWidth:
    iVar5 = 9;
    goto switchD_003376e9_caseD_3;
  case PM_TitleBarHeight:
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (opt->type != 0xf0005)) {
      qVar9 = 18.0;
      break;
    }
    if (*(char *)((long)&opt[1].palette.d + 4) == '\v') {
      if (widget == (QWidget *)0x0) {
        iVar5 = QFontMetrics::height();
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          bVar8 = SBORROW4(iVar5,0x11);
          iVar1 = iVar5 + -0x11;
          iVar2 = 0x10;
LAB_00337c9b:
          if (bVar8 != iVar1 < 0) {
            return iVar2;
          }
          return iVar5;
        }
        goto LAB_00337ca5;
      }
      QFontMetrics::QFontMetrics((QFontMetrics *)&local_50,&widget->data->fnt);
      iVar2 = QFontMetrics::height();
      bVar8 = SBORROW4(iVar2,0x11);
      iVar1 = iVar2 + -0x11;
      iVar5 = 0x10;
LAB_00337c67:
      if (bVar8 == iVar1 < 0) {
        iVar5 = iVar2;
      }
    }
    else {
      lVar4 = QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
      if (lVar4 == 0) {
        if (widget == (QWidget *)0x0) {
          iVar5 = QFontMetrics::height();
          if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
            bVar8 = SBORROW4(iVar5,0x13);
            iVar1 = iVar5 + -0x13;
            iVar2 = 0x12;
            goto LAB_00337c9b;
          }
          goto LAB_00337ca5;
        }
        QFontMetrics::QFontMetrics((QFontMetrics *)&local_50,&widget->data->fnt);
        iVar2 = QFontMetrics::height();
        bVar8 = SBORROW4(iVar2,0x13);
        iVar1 = iVar2 + -0x13;
        iVar5 = 0x12;
        goto LAB_00337c67;
      }
      QFontMetrics::QFontMetrics((QFontMetrics *)&local_50,&widget->data->fnt);
      iVar1 = QFontMetrics::height();
      qVar9 = QStyleHelper::dpiScaled(13.0,opt);
      iVar5 = (int)qVar9;
      if ((int)qVar9 < iVar1) {
        iVar5 = iVar1;
      }
    }
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_50);
    goto switchD_003376e9_caseD_3;
  case PM_MenuScrollerHeight:
  case PM_MenuTearoffHeight:
    qVar9 = 10.0;
    break;
  case PM_IndicatorWidth:
  case PM_IndicatorHeight:
  case PM_SizeGripSize:
    qVar9 = 13.0;
    break;
  case PM_MdiSubWindowFrameWidth:
  case PM_HeaderMargin:
  case PM_HeaderGripMargin:
  case PM_ToolBarItemSpacing:
    qVar9 = 4.0;
    break;
  case PM_MdiSubWindowMinimizedWidth:
    qVar9 = 196.0;
    break;
  case PM_ToolBarFrameWidth:
  case PM_ToolTipLabelFrameWidth:
  case PM_TabBar_ScrollButtonOverlap:
    iVar5 = 1;
    goto switchD_003376e9_caseD_3;
  case PM_ToolBarIconSize:
    if (QGuiApplicationPrivate::platform_theme != (long *)0x0) {
      (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x60))
                (&local_50,QGuiApplicationPrivate::platform_theme,0xc);
      iVar5 = ::QVariant::toInt((bool *)&local_50);
      ::QVariant::~QVariant(&local_50);
      if (0 < iVar5) goto switchD_003376e9_caseD_3;
    }
    goto switchD_003376e9_caseD_14;
  case PM_ListViewIconSize:
    pQVar3 = (QStyle *)QMetaObject::cast((QObject *)&QSidebar::staticMetaObject);
    if (pQVar3 == (QStyle *)0x0) goto switchD_003376e9_caseD_44;
switchD_003376e9_caseD_14:
    qVar9 = 24.0;
    break;
  case PM_IconViewIconSize:
    pQVar3 = QStyle::proxy(pQVar3);
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)pQVar3 + 0xe0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      uVar6 = 0x3f;
      goto LAB_003379d3;
    }
    goto LAB_00337ca5;
  case PM_LargeIconSize:
  case PM_MessageBoxIconSize:
    qVar9 = 32.0;
    break;
  case PM_TabBarIconSize:
  case PM_LineEditIconSize:
switchD_003376e9_caseD_44:
    pQVar3 = QStyle::proxy(pQVar3);
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)pQVar3 + 0xe0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      uVar6 = 0x3e;
LAB_003379d3:
      iVar5 = (*UNRECOVERED_JUMPTABLE)(pQVar3,uVar6,opt,widget,UNRECOVERED_JUMPTABLE);
      return iVar5;
    }
    goto LAB_00337ca5;
  case PM_DockWidgetTitleBarButtonMargin:
    qVar9 = 2.0;
    break;
  case PM_LayoutLeftMargin:
  case PM_LayoutTopMargin:
  case PM_LayoutRightMargin:
  case PM_LayoutBottomMargin:
    if (opt == (QStyleOption *)0x0) {
      qVar9 = 9.0;
      if ((widget != (QWidget *)0x0) &&
         (((widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) goto LAB_003377c4;
    }
    else {
      if (((opt->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
           super_QFlagsStorage<QStyle::StateFlag>.i >> 0x11 & 1) == 0)
      goto switchD_003376e9_caseD_a;
LAB_003377c4:
      qVar9 = 11.0;
    }
    break;
  case PM_TextCursorWidth:
    lVar4 = *QGuiApplicationPrivate::platform_theme;
    uVar6 = 8;
LAB_00337a6e:
    (**(code **)(lVar4 + 0x60))(&local_50,QGuiApplicationPrivate::platform_theme,uVar6);
    iVar5 = ::QVariant::toInt((bool *)&local_50);
    ::QVariant::~QVariant(&local_50);
    goto switchD_003376e9_caseD_3;
  case PM_ScrollView_ScrollBarSpacing:
    pQVar3 = QStyle::proxy(pQVar3);
    iVar5 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,5,opt,widget);
    iVar5 = iVar5 * 2;
    goto switchD_003376e9_caseD_3;
  case PM_SubMenuOverlap:
    pQVar3 = QStyle::proxy(pQVar3);
    iVar5 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x1e,opt,widget);
    iVar5 = -iVar5;
    goto switchD_003376e9_caseD_3;
  case PM_TreeViewIndentation:
    qVar9 = 20.0;
    break;
  case PM_HeaderDefaultSectionSizeHorizontal:
    qVar9 = 100.0;
    break;
  case PM_HeaderDefaultSectionSizeVertical:
    qVar9 = 30.0;
    break;
  case PM_LineEditIconMargin:
    pQVar3 = QStyle::proxy(pQVar3);
    iVar1 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x5d,opt,widget);
    iVar5 = iVar1 + 3;
    if (-1 < iVar1) {
      iVar5 = iVar1;
    }
    iVar5 = iVar5 >> 2;
    goto switchD_003376e9_caseD_3;
  }
  qVar9 = QStyleHelper::dpiScaled(qVar9,opt);
  iVar5 = (int)qVar9;
switchD_003376e9_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar5;
  }
LAB_00337ca5:
  __stack_chk_fail();
}

Assistant:

int QCommonStyle::pixelMetric(PixelMetric m, const QStyleOption *opt, const QWidget *widget) const
{
    int ret;

    switch (m) {
    case PM_FocusFrameVMargin:
    case PM_FocusFrameHMargin:
        ret = 2;
        break;
    case PM_MenuBarVMargin:
    case PM_MenuBarHMargin:
        ret = 0;
        break;
    case PM_TitleBarHeight:
    {
        if (const QStyleOptionTitleBar *tb = qstyleoption_cast<const QStyleOptionTitleBar *>(opt)) {
            if ((tb->titleBarFlags & Qt::WindowType_Mask) == Qt::Tool) {
                ret = qMax(widget ? widget->fontMetrics().height() : opt->fontMetrics.height(), 16);
#if QT_CONFIG(dockwidget)
            } else if (qobject_cast<const QDockWidget*>(widget)) {
                ret = qMax(widget->fontMetrics().height(), int(QStyleHelper::dpiScaled(13, opt)));
#endif
            } else {
                ret = qMax(widget ? widget->fontMetrics().height() : opt->fontMetrics.height(), 18);
            }
        } else {
            ret = int(QStyleHelper::dpiScaled(18., opt));
        }
        break;
    }
    case PM_TitleBarButtonSize:
        ret = int(QStyleHelper::dpiScaled(16., opt));
        break;
    case PM_TitleBarButtonIconSize:
        ret = int(QStyleHelper::dpiScaled(16., opt));
        break;

    case PM_ScrollBarSliderMin:
        ret = int(QStyleHelper::dpiScaled(9., opt));
        break;

    case PM_ButtonMargin:
        ret = int(QStyleHelper::dpiScaled(6., opt));
        break;

    case PM_DockWidgetTitleBarButtonMargin:
        ret = int(QStyleHelper::dpiScaled(2., opt));
        break;

    case PM_ButtonDefaultIndicator:
        ret = 0;
        break;

    case PM_MenuButtonIndicator:
        ret = int(QStyleHelper::dpiScaled(12, opt));
        break;

    case PM_ButtonShiftHorizontal:
    case PM_ButtonShiftVertical:

    case PM_DefaultFrameWidth:
        ret = 2;
        break;

    case PM_ComboBoxFrameWidth:
    case PM_SpinBoxFrameWidth:
    case PM_MenuPanelWidth:
    case PM_TabBarBaseOverlap:
    case PM_TabBarBaseHeight:
        ret = proxy()->pixelMetric(PM_DefaultFrameWidth, opt, widget);
        break;

    case PM_MdiSubWindowFrameWidth:
        ret = int(QStyleHelper::dpiScaled(4, opt));
        break;

    case PM_MdiSubWindowMinimizedWidth:
        ret = int(QStyleHelper::dpiScaled(196, opt));
        break;

#if QT_CONFIG(scrollbar)
    case PM_ScrollBarExtent:
        if (qstyleoption_cast<const QStyleOptionSlider *>(opt))
            ret = 16;
        else
            ret = int(QStyleHelper::dpiScaled(16, opt));
        break;
#endif
    case PM_MaximumDragDistance:
        ret = QGuiApplicationPrivate::platformTheme()->themeHint(QPlatformTheme::MaximumScrollBarDragDistance).toInt();
        break;

#if QT_CONFIG(slider)
    case PM_SliderThickness:
        ret = int(QStyleHelper::dpiScaled(16, opt));
        break;

    case PM_SliderTickmarkOffset:
        if (const QStyleOptionSlider *sl = qstyleoption_cast<const QStyleOptionSlider *>(opt)) {
            int space = (sl->orientation == Qt::Horizontal) ? sl->rect.height()
                                                            : sl->rect.width();
            int thickness = proxy()->pixelMetric(PM_SliderControlThickness, sl, widget);
            int ticks = sl->tickPosition;

            if (ticks == QSlider::TicksBothSides)
                ret = (space - thickness) / 2;
            else if (ticks == QSlider::TicksAbove)
                ret = space - thickness;
            else
                ret = 0;
        } else {
            ret = 0;
        }
        break;

    case PM_SliderSpaceAvailable:
        if (const QStyleOptionSlider *sl = qstyleoption_cast<const QStyleOptionSlider *>(opt)) {
            if (sl->orientation == Qt::Horizontal)
                ret = sl->rect.width() - proxy()->pixelMetric(PM_SliderLength, sl, widget);
            else
                ret = sl->rect.height() - proxy()->pixelMetric(PM_SliderLength, sl, widget);
        } else {
            ret = 0;
        }
        break;
#endif // QT_CONFIG(slider)
#if QT_CONFIG(dockwidget)
    case PM_DockWidgetSeparatorExtent:
        ret = int(QStyleHelper::dpiScaled(6, opt));
        break;

    case PM_DockWidgetHandleExtent:
        ret = int(QStyleHelper::dpiScaled(8, opt));
        break;
    case PM_DockWidgetTitleMargin:
        ret = 0;
        break;
    case PM_DockWidgetFrameWidth:
        ret = int(QStyleHelper::dpiScaled(1, opt));
        break;
#endif // QT_CONFIG(dockwidget)

    case PM_SpinBoxSliderHeight:
    case PM_MenuBarPanelWidth:
        ret = 2;
        break;

    case PM_MenuBarItemSpacing:
        ret = 0;
        break;

#if QT_CONFIG(toolbar)
    case PM_ToolBarFrameWidth:
        ret = 1;
        break;

    case PM_ToolBarItemMargin:
        ret = 0;
        break;

    case PM_ToolBarItemSpacing:
        ret = int(QStyleHelper::dpiScaled(4, opt));
        break;

    case PM_ToolBarHandleExtent:
        ret = int(QStyleHelper::dpiScaled(8, opt));
        break;

    case PM_ToolBarSeparatorExtent:
        ret = int(QStyleHelper::dpiScaled(6, opt));
        break;

    case PM_ToolBarExtensionExtent:
        ret = int(QStyleHelper::dpiScaled(12, opt));
        break;
#endif // QT_CONFIG(toolbar)

#if QT_CONFIG(tabbar)
    case PM_TabBarTabOverlap:
        ret = 3;
        break;

    case PM_TabBarTabHSpace:
        ret = int(QStyleHelper::dpiScaled(24, opt));
        break;

    case PM_TabBarTabShiftHorizontal:
        ret = 0;
        break;

    case PM_TabBarTabShiftVertical:
        ret = 2;
        break;

    case PM_TabBarTabVSpace:
    {
        const QStyleOptionTab *tb = qstyleoption_cast<const QStyleOptionTab *>(opt);
        if (tb && (tb->shape == QTabBar::RoundedNorth || tb->shape == QTabBar::RoundedSouth
                   || tb->shape == QTabBar::RoundedWest || tb->shape == QTabBar::RoundedEast))
            ret = 8;
        else
            if (tb && (tb->shape == QTabBar::TriangularWest || tb->shape == QTabBar::TriangularEast))
                ret = 3;
            else
                ret = 2;
        break;
    }
#endif

    case PM_ProgressBarChunkWidth:
        ret = 9;
        break;

    case PM_IndicatorWidth:
        ret = int(QStyleHelper::dpiScaled(13, opt));
        break;

    case PM_IndicatorHeight:
        ret = int(QStyleHelper::dpiScaled(13, opt));
        break;

    case PM_ExclusiveIndicatorWidth:
        ret = int(QStyleHelper::dpiScaled(12, opt));
        break;

    case PM_ExclusiveIndicatorHeight:
        ret = int(QStyleHelper::dpiScaled(12, opt));
        break;

    case PM_MenuTearoffHeight:
        ret = int(QStyleHelper::dpiScaled(10, opt));
        break;

    case PM_MenuScrollerHeight:
        ret = int(QStyleHelper::dpiScaled(10, opt));
        break;

    case PM_MenuDesktopFrameWidth:
    case PM_MenuHMargin:
    case PM_MenuVMargin:
        ret = 0;
        break;

    case PM_HeaderMargin:
        ret = int(QStyleHelper::dpiScaled(4, opt));
        break;
    case PM_HeaderMarkSize:
        ret = int(QStyleHelper::dpiScaled(16, opt));
        break;
    case PM_HeaderGripMargin:
        ret = int(QStyleHelper::dpiScaled(4, opt));
        break;
    case PM_HeaderDefaultSectionSizeHorizontal:
        ret = int(QStyleHelper::dpiScaled(100, opt));
        break;
    case PM_HeaderDefaultSectionSizeVertical:
        ret = int(QStyleHelper::dpiScaled(30, opt));
        break;
    case PM_TabBarScrollButtonWidth:
        ret = int(QStyleHelper::dpiScaled(16, opt));
        break;
    case PM_LayoutLeftMargin:
    case PM_LayoutTopMargin:
    case PM_LayoutRightMargin:
    case PM_LayoutBottomMargin:
    {
        bool isWindow = false;
        if (opt) {
            isWindow = (opt->state & State_Window);
        } else if (widget) {
            isWindow = widget->isWindow();
        }
        ret = int(QStyleHelper::dpiScaled(isWindow ? 11 : 9, opt));
        break;
    }
    case PM_LayoutHorizontalSpacing:
    case PM_LayoutVerticalSpacing:
        ret = int(QStyleHelper::dpiScaled(6, opt));
        break;

    case PM_ToolBarIconSize:
        ret = 0;
        if (const QPlatformTheme *theme = QGuiApplicationPrivate::platformTheme())
            ret = theme->themeHint(QPlatformTheme::ToolBarIconSize).toInt();
        if (ret <= 0)
            ret =  int(QStyleHelper::dpiScaled(24, opt));
        break;

    case PM_TabBarIconSize:
        ret = proxy()->pixelMetric(PM_SmallIconSize, opt, widget);
        break;
    case PM_ListViewIconSize:
#if QT_CONFIG(filedialog)
        if (qobject_cast<const QSidebar *>(widget))
            ret = int(QStyleHelper::dpiScaled(24., opt));
        else
#endif
            ret = proxy()->pixelMetric(PM_SmallIconSize, opt, widget);
        break;

    case PM_ButtonIconSize:
    case PM_SmallIconSize:
        ret = int(QStyleHelper::dpiScaled(16, opt));
        break;
    case PM_IconViewIconSize:
        ret = proxy()->pixelMetric(PM_LargeIconSize, opt, widget);
        break;
    case PM_LineEditIconSize:
        ret = proxy()->pixelMetric(PM_SmallIconSize, opt, widget);
        break;
    case PM_LineEditIconMargin:
        ret = proxy()->pixelMetric(PM_LineEditIconSize, opt, widget) / 4;
        break;

    case PM_LargeIconSize:
        ret = int(QStyleHelper::dpiScaled(32, opt));
        break;

    case PM_ToolTipLabelFrameWidth:
        ret = 1;
        break;
    case PM_CheckBoxLabelSpacing:
    case PM_RadioButtonLabelSpacing:
        ret = int(QStyleHelper::dpiScaled(6, opt));
        break;
    case PM_SizeGripSize:
        ret = int(QStyleHelper::dpiScaled(13, opt));
        break;
    case PM_MessageBoxIconSize:
#ifdef Q_OS_MAC
        if (QGuiApplication::desktopSettingsAware()) {
            ret = 64; // No DPI scaling, it's handled elsewhere.
        } else
#endif
        {
            ret = int(QStyleHelper::dpiScaled(32, opt));
        }
        break;
    case PM_TextCursorWidth:
        ret = QGuiApplicationPrivate::platformTheme()->themeHint(QPlatformTheme::TextCursorWidth).toInt();
        break;
    case PM_TabBar_ScrollButtonOverlap:
        ret = 1;
        break;
    case PM_TabCloseIndicatorWidth:
    case PM_TabCloseIndicatorHeight:
        ret = int(QStyleHelper::dpiScaled(16, opt));
        break;
    case PM_ScrollView_ScrollBarSpacing:
        ret = 2 * proxy()->pixelMetric(PM_DefaultFrameWidth, opt, widget);
        break;
    case PM_ScrollView_ScrollBarOverlap:
        ret = 0;
        break;
    case PM_SubMenuOverlap:
        ret = -proxy()->pixelMetric(QStyle::PM_MenuPanelWidth, opt, widget);
        break;
    case PM_TreeViewIndentation:
        ret = int(QStyleHelper::dpiScaled(20, opt));
        break;
    default:
        ret = 0;
        break;
    }

    return ret;
}